

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

bilingual_str * common::PSBTErrorString(PSBTError err)

{
  allocator<char> *__a;
  uint in_ESI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator<char> local_ad;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9 [161];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator<char> *)(ulong)in_ESI;
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
    Untranslated(&in_RDI->original);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator(local_a9);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
    Untranslated(&in_RDI->original);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator(&local_aa);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
    Untranslated(&in_RDI->original);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator(&local_ab);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
    Untranslated(&in_RDI->original);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator(&local_ac);
    break;
  case (allocator<char> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
    Untranslated(&in_RDI->original);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator(&local_ad);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x79,"bilingual_str common::PSBTErrorString(PSBTError)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

bilingual_str PSBTErrorString(PSBTError err)
{
    switch (err) {
        case PSBTError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case PSBTError::SIGHASH_MISMATCH:
            return Untranslated("Specified sighash value does not match value stored in PSBT");
        case PSBTError::EXTERNAL_SIGNER_NOT_FOUND:
            return Untranslated("External signer not found");
        case PSBTError::EXTERNAL_SIGNER_FAILED:
            return Untranslated("External signer failed to sign");
        case PSBTError::UNSUPPORTED:
            return Untranslated("Signer does not support PSBT");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}